

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeTest_AND(Fts5Expr *pExpr,Fts5ExprNode *pAnd)

{
  Fts5ExprNode *pFVar1;
  int iVar2;
  int iVar3;
  Fts5ExprNode *in_RSI;
  Fts5Expr *in_RDI;
  int cmp;
  Fts5ExprNode *pChild;
  int bMatch;
  int rc;
  i64 iLast;
  int iChild;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined4 uVar5;
  i64 local_28;
  int local_1c;
  
  local_28 = in_RSI->iRowid;
  uVar5 = 0;
  do {
    in_RSI->bNomatch = 0;
    iVar4 = 1;
    for (local_1c = 0; local_1c < in_RSI->nChild; local_1c = local_1c + 1) {
      pFVar1 = in_RSI->apChild[local_1c];
      iVar2 = fts5RowidCmp(in_RDI,local_28,pFVar1->iRowid);
      if (0 < iVar2) {
        iVar3 = (*pFVar1->xNext)(in_RDI,pFVar1,1,local_28);
        if (iVar3 != 0) {
          in_RSI->bNomatch = 0;
          return iVar3;
        }
        uVar5 = 0;
      }
      if (pFVar1->bEof != 0) {
        fts5ExprSetEof((Fts5ExprNode *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
        iVar4 = 1;
        break;
      }
      if (local_28 != pFVar1->iRowid) {
        iVar4 = 0;
        local_28 = pFVar1->iRowid;
      }
      if (pFVar1->bNomatch != 0) {
        in_RSI->bNomatch = 1;
      }
    }
    if (iVar4 != 0) {
      if ((in_RSI->bNomatch != 0) && (in_RSI != in_RDI->pRoot)) {
        fts5ExprNodeZeroPoslist((Fts5ExprNode *)CONCAT44(uVar5,iVar4));
      }
      in_RSI->iRowid = local_28;
      return 0;
    }
  } while( true );
}

Assistant:

static int fts5ExprNodeTest_AND(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pAnd              /* FTS5_AND node to advance */
){
  int iChild;
  i64 iLast = pAnd->iRowid;
  int rc = SQLITE_OK;
  int bMatch;

  assert( pAnd->bEof==0 );
  do {
    pAnd->bNomatch = 0;
    bMatch = 1;
    for(iChild=0; iChild<pAnd->nChild; iChild++){
      Fts5ExprNode *pChild = pAnd->apChild[iChild];
      int cmp = fts5RowidCmp(pExpr, iLast, pChild->iRowid);
      if( cmp>0 ){
        /* Advance pChild until it points to iLast or laster */
        rc = fts5ExprNodeNext(pExpr, pChild, 1, iLast);
        if( rc!=SQLITE_OK ){
          pAnd->bNomatch = 0;
          return rc;
        }
      }

      /* If the child node is now at EOF, so is the parent AND node. Otherwise,
      ** the child node is guaranteed to have advanced at least as far as
      ** rowid iLast. So if it is not at exactly iLast, pChild->iRowid is the
      ** new lastest rowid seen so far.  */
      assert( pChild->bEof || fts5RowidCmp(pExpr, iLast, pChild->iRowid)<=0 );
      if( pChild->bEof ){
        fts5ExprSetEof(pAnd);
        bMatch = 1;
        break;
      }else if( iLast!=pChild->iRowid ){
        bMatch = 0;
        iLast = pChild->iRowid;
      }

      if( pChild->bNomatch ){
        pAnd->bNomatch = 1;
      }
    }
  }while( bMatch==0 );

  if( pAnd->bNomatch && pAnd!=pExpr->pRoot ){
    fts5ExprNodeZeroPoslist(pAnd);
  }
  pAnd->iRowid = iLast;
  return SQLITE_OK;
}